

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

bool __thiscall QWidgetPrivate::setMaximumSize_helper(QWidgetPrivate *this,int *maxw,int *maxh)

{
  undefined8 *puVar1;
  QWExtra *pQVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  undefined8 uVar6;
  int iVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_88;
  QArrayDataPointer<char> local_70;
  char local_58 [24];
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = *(undefined8 **)&this->field_0x8;
  iVar4 = *maxw;
  if ((0xffffff < iVar4) || (iVar7 = *maxh, 0xffffff < iVar7)) {
    local_58[0] = '\x02';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[0x14] = '\0';
    local_58[0x15] = '\0';
    local_58[0x16] = '\0';
    local_58[0x17] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    local_58[0x10] = '\0';
    local_58[0x11] = '\0';
    local_58[0x12] = '\0';
    local_58[0x13] = '\0';
    local_40 = "default";
    QObject::objectName();
    QString::toLocal8Bit((QByteArray *)&local_70,(QString *)&QStack_88);
    pcVar5 = QByteArray::data((QByteArray *)&local_70);
    (**(code **)*puVar1)(puVar1);
    uVar6 = QMetaObject::className();
    QMessageLogger::warning
              (local_58,"QWidget::setMaximumSize: (%s/%s) The largest allowed size is (%d,%d)",
               pcVar5,uVar6,0xffffff,0xffffff);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_88);
    iVar4 = *maxw;
    if (0xfffffe < iVar4) {
      iVar4 = 0xffffff;
    }
    *maxw = iVar4;
    iVar7 = 0xffffff;
    if (*maxh < 0xffffff) {
      iVar7 = *maxh;
    }
    *maxh = iVar7;
    iVar4 = *maxw;
  }
  if ((iVar4 < 0) || (iVar7 < 0)) {
    local_58[0] = '\x02';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[0x14] = '\0';
    local_58[0x15] = '\0';
    local_58[0x16] = '\0';
    local_58[0x17] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
    local_58[0x10] = '\0';
    local_58[0x11] = '\0';
    local_58[0x12] = '\0';
    local_58[0x13] = '\0';
    local_40 = "default";
    QObject::objectName();
    QString::toLocal8Bit((QByteArray *)&local_70,(QString *)&QStack_88);
    pcVar5 = QByteArray::data((QByteArray *)&local_70);
    (**(code **)*puVar1)(puVar1);
    uVar6 = QMetaObject::className();
    QMessageLogger::warning
              (local_58,"QWidget::setMaximumSize: (%s/%s) Negative sizes (%d,%d) are not possible",
               pcVar5,uVar6,(ulong)(uint)*maxw,(ulong)(uint)*maxh);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_88);
    iVar4 = *maxw;
    if (iVar4 < 1) {
      iVar4 = 0;
    }
    *maxw = iVar4;
    iVar4 = 0;
    if (0 < *maxh) {
      iVar4 = *maxh;
    }
    *maxh = iVar4;
  }
  createExtra(this);
  pQVar2 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  if ((pQVar2->maxw == *maxw) && (pQVar2->maxh == *maxh)) {
    bVar3 = false;
  }
  else {
    pQVar2->maxw = *maxw;
    iVar4 = *maxh;
    pQVar2->maxh = iVar4;
    *(ushort *)&pQVar2->field_0x7c =
         (ushort)*(undefined4 *)&pQVar2->field_0x7c & 0xfff3 |
         (ushort)(*maxw != 0xffffff) * 4 + (ushort)(iVar4 != 0xffffff) * 8;
    bVar3 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QWidgetPrivate::setMaximumSize_helper(int &maxw, int &maxh)
{
    Q_Q(QWidget);
    if (Q_UNLIKELY(maxw > QWIDGETSIZE_MAX || maxh > QWIDGETSIZE_MAX)) {
        qWarning("QWidget::setMaximumSize: (%s/%s) "
                "The largest allowed size is (%d,%d)",
                 q->objectName().toLocal8Bit().data(), q->metaObject()->className(), QWIDGETSIZE_MAX,
                QWIDGETSIZE_MAX);
        maxw = qMin<int>(maxw, QWIDGETSIZE_MAX);
        maxh = qMin<int>(maxh, QWIDGETSIZE_MAX);
    }
    if (Q_UNLIKELY(maxw < 0 || maxh < 0)) {
        qWarning("QWidget::setMaximumSize: (%s/%s) Negative sizes (%d,%d) "
                "are not possible",
                q->objectName().toLocal8Bit().data(), q->metaObject()->className(), maxw, maxh);
        maxw = qMax(maxw, 0);
        maxh = qMax(maxh, 0);
    }
    createExtra();
    if (extra->maxw == maxw && extra->maxh == maxh)
        return false;
    extra->maxw = maxw;
    extra->maxh = maxh;
    extra->explicitMaxSize = (maxw != QWIDGETSIZE_MAX ? Qt::Horizontal : 0) |
                             (maxh != QWIDGETSIZE_MAX ? Qt::Vertical : 0);
    return true;
}